

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QWidget*>>
          (QtPrivate *this,QDebug debug,char *which,QList<QWidget_*> *c)

{
  QWidget **ppQVar1;
  char *pcVar2;
  QTextStream *pQVar3;
  long lVar4;
  undefined8 uVar5;
  storage_type *psVar6;
  storage_type *psVar7;
  QWidget **ppQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  undefined1 local_78 [24];
  undefined1 local_60 [8];
  QWidgetData *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar3 = *(QTextStream **)debug.stream;
  pQVar3[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar7 = (storage_type *)0x0;
  }
  else {
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      psVar7 = psVar6 + 1;
      pcVar2 = which + 1 + (long)psVar6;
      psVar6 = psVar7;
    } while (*pcVar2 != '\0');
  }
  QVar9.m_data = psVar7;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar3,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  ppQVar8 = (c->d).ptr;
  lVar4 = (c->d).size;
  ppQVar1 = ppQVar8 + lVar4;
  if (lVar4 != 0) {
    local_78._16_8_ = *(undefined8 *)debug.stream;
    *(int *)(local_78._16_8_ + 0x28) = *(int *)(local_78._16_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_60,(QWidget *)(local_78 + 0x10));
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)(local_78 + 0x10));
    ppQVar8 = ppQVar8 + 1;
  }
  if (ppQVar8 != ppQVar1) {
    do {
      pQVar3 = *(QTextStream **)debug.stream;
      QVar10.m_data = (storage_type *)0x2;
      QVar10.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<(pQVar3,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_78._0_8_ = *(undefined8 *)debug.stream;
      *(int *)(local_78._0_8_ + 0x28) = *(int *)(local_78._0_8_ + 0x28) + 1;
      ::operator<<((Stream *)(local_78 + 8),(QWidget *)local_78);
      QDebug::~QDebug((QDebug *)(local_78 + 8));
      QDebug::~QDebug((QDebug *)local_78);
      ppQVar8 = ppQVar8 + 1;
    } while (ppQVar8 != ppQVar1);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar5 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar5;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}